

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform_pack8.h
# Opt level: O1

void ncnn::conv3x3s1_winograd63_transform_input_pack8_avx
               (Mat *bottom_blob,Mat *bottom_blob_tm,Option *opt)

{
  float *pfVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  void *pvVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  uint uVar44;
  uint uVar45;
  int iVar46;
  long lVar47;
  ulong uVar48;
  ulong uVar49;
  long lVar50;
  long lVar51;
  ulong uVar52;
  undefined1 (*pauVar53) [32];
  long lVar54;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  float fVar66;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  float fVar78;
  undefined1 auVar79 [32];
  undefined1 auVar80 [64];
  float fVar81;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  float fVar101;
  float tmp [8] [8] [8];
  long local_900;
  long local_8f8;
  long local_8f0;
  float afStack_860 [8];
  undefined1 auStack_840 [32];
  undefined1 auStack_820 [32];
  undefined1 auStack_800 [32];
  undefined1 auStack_7e0 [32];
  undefined1 auStack_7c0 [32];
  undefined1 auStack_7a0 [32];
  undefined1 auStack_780 [32];
  float afStack_760 [128];
  float afStack_560 [128];
  float afStack_360 [128];
  float afStack_160 [76];
  
  iVar4 = bottom_blob->c;
  if (0 < (long)iVar4) {
    iVar5 = bottom_blob->w;
    iVar6 = bottom_blob->h;
    uVar44 = (iVar6 + -2) / 6;
    uVar45 = (iVar5 + -2) / 6;
    iVar46 = uVar44 * uVar45;
    uVar49 = 1;
    if (1 < (int)uVar45) {
      uVar49 = (ulong)uVar45;
    }
    if ((int)uVar44 < 2) {
      uVar44 = 1;
    }
    auVar100 = ZEXT3264(CONCAT428(0x3f000000,
                                  CONCAT424(0x3f000000,
                                            CONCAT420(0x3f000000,
                                                      CONCAT416(0x3f000000,
                                                                CONCAT412(0x3f000000,
                                                                          CONCAT48(0x3f000000,
                                                                                                                                                                      
                                                  0x3f0000003f000000)))))));
    auVar80 = ZEXT3264(CONCAT428(0x40800000,
                                 CONCAT424(0x40800000,
                                           CONCAT420(0x40800000,
                                                     CONCAT416(0x40800000,
                                                               CONCAT412(0x40800000,
                                                                         CONCAT48(0x40800000,
                                                                                  0x4080000040800000
                                                                                 )))))));
    local_900 = 0;
    do {
      if (7 < iVar6) {
        iVar7 = bottom_blob->w;
        sVar8 = bottom_blob->elemsize;
        local_8f0 = (long)bottom_blob->data + sVar8 * bottom_blob->cstep * local_900 + 0xe0;
        lVar51 = bottom_blob_tm->elemsize * bottom_blob_tm->cstep * local_900;
        pvVar9 = bottom_blob_tm->data;
        local_8f8 = 0;
        uVar48 = 0;
        do {
          if (7 < iVar5) {
            uVar52 = 0;
            lVar50 = local_8f8;
            do {
              pauVar53 = (undefined1 (*) [32])(((long)((uVar52 << 0x24) * 3) >> 0x1e) + local_8f0);
              lVar47 = -0x100;
              do {
                auVar2 = pauVar53[-6];
                auVar79 = auVar80._0_32_;
                auVar59 = pauVar53[-5];
                auVar76 = pauVar53[-4];
                auVar77 = pauVar53[-3];
                auVar3 = pauVar53[-2];
                auVar98 = auVar100._0_32_;
                auVar55 = pauVar53[-1];
                auVar40 = vsubps_avx(auVar77,auVar59);
                auVar41 = vsubps_avx(pauVar53[-7],auVar55);
                auVar42 = vsubps_avx(auVar76,auVar3);
                auVar43 = vsubps_avx(*pauVar53,auVar2);
                fVar101 = auVar43._28_4_;
                fVar10 = auVar55._0_4_;
                fVar70 = auVar59._0_4_;
                fVar12 = auVar55._4_4_;
                fVar71 = auVar59._4_4_;
                fVar14 = auVar55._8_4_;
                fVar72 = auVar59._8_4_;
                fVar16 = auVar55._12_4_;
                fVar73 = auVar59._12_4_;
                fVar18 = auVar55._16_4_;
                fVar74 = auVar59._16_4_;
                fVar20 = auVar55._20_4_;
                fVar75 = auVar59._20_4_;
                fVar22 = auVar55._24_4_;
                fVar78 = auVar59._24_4_;
                fVar24 = auVar55._28_4_;
                auVar55._0_4_ = auVar77._0_4_ * -4.25 + fVar70 + fVar10;
                auVar55._4_4_ = auVar77._4_4_ * -4.25 + fVar71 + fVar12;
                auVar55._8_4_ = auVar77._8_4_ * -4.25 + fVar72 + fVar14;
                auVar55._12_4_ = auVar77._12_4_ * -4.25 + fVar73 + fVar16;
                auVar55._16_4_ = auVar77._16_4_ * -4.25 + fVar74 + fVar18;
                auVar55._20_4_ = auVar77._20_4_ * -4.25 + fVar75 + fVar20;
                auVar55._24_4_ = auVar77._24_4_ * -4.25 + fVar78 + fVar22;
                auVar55._28_4_ = fVar101 + auVar59._28_4_ + fVar24;
                fVar11 = auVar2._0_4_;
                fVar90 = auVar3._0_4_;
                fVar13 = auVar2._4_4_;
                fVar60 = auVar3._4_4_;
                fVar15 = auVar2._8_4_;
                fVar61 = auVar3._8_4_;
                fVar17 = auVar2._12_4_;
                fVar62 = auVar3._12_4_;
                fVar19 = auVar2._16_4_;
                fVar63 = auVar3._16_4_;
                fVar21 = auVar2._20_4_;
                fVar64 = auVar3._20_4_;
                fVar23 = auVar2._24_4_;
                fVar65 = auVar3._24_4_;
                fVar25 = auVar2._28_4_;
                fVar66 = auVar3._28_4_;
                auVar57._0_4_ = auVar76._0_4_ * -4.25 + fVar90 + fVar11;
                auVar57._4_4_ = auVar76._4_4_ * -4.25 + fVar60 + fVar13;
                auVar57._8_4_ = auVar76._8_4_ * -4.25 + fVar61 + fVar15;
                auVar57._12_4_ = auVar76._12_4_ * -4.25 + fVar62 + fVar17;
                auVar57._16_4_ = auVar76._16_4_ * -4.25 + fVar63 + fVar19;
                auVar57._20_4_ = auVar76._20_4_ * -4.25 + fVar64 + fVar21;
                auVar57._24_4_ = auVar76._24_4_ * -4.25 + fVar65 + fVar23;
                auVar57._28_4_ = fVar101 + fVar66 + fVar25;
                auVar2 = vsubps_avx(auVar55,auVar57);
                fVar91 = auVar77._0_4_ * -1.25;
                fVar92 = auVar77._4_4_ * -1.25;
                fVar93 = auVar77._8_4_ * -1.25;
                fVar94 = auVar77._12_4_ * -1.25;
                fVar95 = auVar77._16_4_ * -1.25;
                fVar96 = auVar77._20_4_ * -1.25;
                fVar97 = auVar77._24_4_ * -1.25;
                auVar58._0_4_ = fVar10 + fVar91 + fVar70 * 0.25;
                auVar58._4_4_ = fVar12 + fVar92 + fVar71 * 0.25;
                auVar58._8_4_ = fVar14 + fVar93 + fVar72 * 0.25;
                auVar58._12_4_ = fVar16 + fVar94 + fVar73 * 0.25;
                auVar58._16_4_ = fVar18 + fVar95 + fVar74 * 0.25;
                auVar58._20_4_ = fVar20 + fVar96 + fVar75 * 0.25;
                auVar58._24_4_ = fVar22 + fVar97 + fVar78 * 0.25;
                auVar58._28_4_ = fVar24 + auVar77._28_4_ + 0.25;
                fVar26 = auVar100._0_4_;
                fVar28 = auVar100._4_4_;
                fVar30 = auVar100._8_4_;
                fVar32 = auVar100._12_4_;
                fVar34 = auVar100._16_4_;
                fVar36 = auVar100._20_4_;
                fVar38 = auVar100._24_4_;
                fVar81 = auVar76._0_4_ * -2.5;
                fVar84 = auVar76._4_4_ * -2.5;
                fVar85 = auVar76._8_4_ * -2.5;
                fVar86 = auVar76._12_4_ * -2.5;
                fVar87 = auVar76._16_4_ * -2.5;
                fVar88 = auVar76._20_4_ * -2.5;
                fVar89 = auVar76._24_4_ * -2.5;
                auVar67._0_4_ = fVar81 + fVar11 * fVar26 + fVar90 + fVar90;
                auVar67._4_4_ = fVar84 + fVar13 * fVar28 + fVar60 + fVar60;
                auVar67._8_4_ = fVar85 + fVar15 * fVar30 + fVar61 + fVar61;
                auVar67._12_4_ = fVar86 + fVar17 * fVar32 + fVar62 + fVar62;
                auVar67._16_4_ = fVar87 + fVar19 * fVar34 + fVar63 + fVar63;
                auVar67._20_4_ = fVar88 + fVar21 * fVar36 + fVar64 + fVar64;
                auVar67._24_4_ = fVar89 + fVar23 * fVar38 + fVar65 + fVar65;
                auVar67._28_4_ = auVar76._28_4_ + -1.25 + fVar66 + fVar66;
                auVar3 = vsubps_avx(auVar58,auVar67);
                fVar27 = auVar80._0_4_;
                fVar29 = auVar80._4_4_;
                fVar31 = auVar80._8_4_;
                fVar33 = auVar80._12_4_;
                fVar35 = auVar80._16_4_;
                fVar37 = auVar80._20_4_;
                fVar39 = auVar80._24_4_;
                auVar68._0_4_ = fVar10 + (fVar91 + fVar70) * fVar27;
                auVar68._4_4_ = fVar12 + (fVar92 + fVar71) * fVar29;
                auVar68._8_4_ = fVar14 + (fVar93 + fVar72) * fVar31;
                auVar68._12_4_ = fVar16 + (fVar94 + fVar73) * fVar33;
                auVar68._16_4_ = fVar18 + (fVar95 + fVar74) * fVar35;
                auVar68._20_4_ = fVar20 + (fVar96 + fVar75) * fVar37;
                auVar68._24_4_ = fVar22 + (fVar97 + fVar78) * fVar39;
                auVar68._28_4_ = fVar24 + auVar77._28_4_ + auVar59._28_4_;
                auVar100 = ZEXT3264(auVar98);
                auVar77._0_4_ = fVar90 * fVar26 + fVar81 + fVar11 + fVar11;
                auVar77._4_4_ = fVar60 * fVar28 + fVar84 + fVar13 + fVar13;
                auVar77._8_4_ = fVar61 * fVar30 + fVar85 + fVar15 + fVar15;
                auVar77._12_4_ = fVar62 * fVar32 + fVar86 + fVar17 + fVar17;
                auVar77._16_4_ = fVar63 * fVar34 + fVar87 + fVar19 + fVar19;
                auVar77._20_4_ = fVar64 * fVar36 + fVar88 + fVar21 + fVar21;
                auVar77._24_4_ = fVar65 * fVar38 + fVar89 + fVar23 + fVar23;
                auVar77._28_4_ = fVar66 + auVar76._28_4_ + fVar25 + fVar25;
                auVar59 = vsubps_avx(auVar68,auVar77);
                *(float *)((long)afStack_760 + lVar47) = auVar41._0_4_ + auVar40._0_4_ * 5.25;
                *(float *)((long)afStack_760 + lVar47 + 4) = auVar41._4_4_ + auVar40._4_4_ * 5.25;
                *(float *)((long)afStack_760 + lVar47 + 8) = auVar41._8_4_ + auVar40._8_4_ * 5.25;
                *(float *)((long)afStack_760 + lVar47 + 0xc) =
                     auVar41._12_4_ + auVar40._12_4_ * 5.25;
                *(float *)((long)afStack_760 + lVar47 + 0x10) =
                     auVar41._16_4_ + auVar40._16_4_ * 5.25;
                *(float *)((long)afStack_760 + lVar47 + 0x14) =
                     auVar41._20_4_ + auVar40._20_4_ * 5.25;
                *(float *)((long)afStack_760 + lVar47 + 0x18) =
                     auVar41._24_4_ + auVar40._24_4_ * 5.25;
                *(float *)((long)afStack_760 + lVar47 + 0x1c) = auVar41._28_4_ + auVar40._28_4_;
                *(float *)((long)afStack_760 + lVar47 + 0x100) = auVar55._0_4_ + auVar57._0_4_;
                *(float *)((long)afStack_760 + lVar47 + 0x104) = auVar55._4_4_ + auVar57._4_4_;
                *(float *)((long)afStack_760 + lVar47 + 0x108) = auVar55._8_4_ + auVar57._8_4_;
                *(float *)((long)afStack_760 + lVar47 + 0x10c) = auVar55._12_4_ + auVar57._12_4_;
                *(float *)((long)afStack_760 + lVar47 + 0x110) = auVar55._16_4_ + auVar57._16_4_;
                *(float *)((long)afStack_760 + lVar47 + 0x114) = auVar55._20_4_ + auVar57._20_4_;
                *(float *)((long)afStack_760 + lVar47 + 0x118) = auVar55._24_4_ + auVar57._24_4_;
                *(float *)((long)afStack_760 + lVar47 + 0x11c) = auVar55._28_4_ + auVar57._28_4_;
                *(undefined1 (*) [32])((long)afStack_560 + lVar47) = auVar2;
                *(float *)((long)afStack_560 + lVar47 + 0x100) = auVar58._0_4_ + auVar67._0_4_;
                *(float *)((long)afStack_560 + lVar47 + 0x104) = auVar58._4_4_ + auVar67._4_4_;
                *(float *)((long)afStack_560 + lVar47 + 0x108) = auVar58._8_4_ + auVar67._8_4_;
                *(float *)((long)afStack_560 + lVar47 + 0x10c) = auVar58._12_4_ + auVar67._12_4_;
                *(float *)((long)afStack_560 + lVar47 + 0x110) = auVar58._16_4_ + auVar67._16_4_;
                *(float *)((long)afStack_560 + lVar47 + 0x114) = auVar58._20_4_ + auVar67._20_4_;
                *(float *)((long)afStack_560 + lVar47 + 0x118) = auVar58._24_4_ + auVar67._24_4_;
                *(float *)((long)afStack_560 + lVar47 + 0x11c) = auVar58._28_4_ + auVar67._28_4_;
                *(undefined1 (*) [32])((long)afStack_360 + lVar47) = auVar3;
                *(float *)((long)afStack_360 + lVar47 + 0x100) = auVar68._0_4_ + auVar77._0_4_;
                *(float *)((long)afStack_360 + lVar47 + 0x104) = auVar68._4_4_ + auVar77._4_4_;
                *(float *)((long)afStack_360 + lVar47 + 0x108) = auVar68._8_4_ + auVar77._8_4_;
                *(float *)((long)afStack_360 + lVar47 + 0x10c) = auVar68._12_4_ + auVar77._12_4_;
                *(float *)((long)afStack_360 + lVar47 + 0x110) = auVar68._16_4_ + auVar77._16_4_;
                *(float *)((long)afStack_360 + lVar47 + 0x114) = auVar68._20_4_ + auVar77._20_4_;
                *(float *)((long)afStack_360 + lVar47 + 0x118) = auVar68._24_4_ + auVar77._24_4_;
                *(float *)((long)afStack_360 + lVar47 + 0x11c) = auVar68._28_4_ + auVar77._28_4_;
                *(undefined1 (*) [32])((long)afStack_160 + lVar47) = auVar59;
                *(float *)((long)afStack_160 + lVar47 + 0x100) =
                     auVar43._0_4_ + auVar42._0_4_ * 5.25;
                *(float *)((long)afStack_160 + lVar47 + 0x104) =
                     auVar43._4_4_ + auVar42._4_4_ * 5.25;
                *(float *)((long)afStack_160 + lVar47 + 0x108) =
                     auVar43._8_4_ + auVar42._8_4_ * 5.25;
                *(float *)((long)afStack_160 + lVar47 + 0x10c) =
                     auVar43._12_4_ + auVar42._12_4_ * 5.25;
                *(float *)((long)afStack_160 + lVar47 + 0x110) =
                     auVar43._16_4_ + auVar42._16_4_ * 5.25;
                *(float *)((long)afStack_160 + lVar47 + 0x114) =
                     auVar43._20_4_ + auVar42._20_4_ * 5.25;
                *(float *)((long)afStack_160 + lVar47 + 0x118) =
                     auVar43._24_4_ + auVar42._24_4_ * 5.25;
                *(float *)((long)afStack_160 + lVar47 + 0x11c) = fVar101 + auVar42._28_4_;
                pauVar53 = (undefined1 (*) [32])(*pauVar53 + (long)(iVar5 * 8) * 4);
                lVar47 = lVar47 + 0x20;
                auVar80 = ZEXT3264(auVar79);
              } while (lVar47 != 0);
              lVar54 = 0;
              lVar47 = lVar50;
              do {
                auVar2 = *(undefined1 (*) [32])(auStack_840 + lVar54);
                auVar59 = *(undefined1 (*) [32])(auStack_820 + lVar54);
                auVar76 = *(undefined1 (*) [32])(auStack_800 + lVar54);
                auVar77 = *(undefined1 (*) [32])(auStack_7e0 + lVar54);
                auVar3 = *(undefined1 (*) [32])(auStack_7c0 + lVar54);
                auVar55 = *(undefined1 (*) [32])(auStack_7a0 + lVar54);
                auVar40 = vsubps_avx(auVar77,auVar59);
                auVar41 = vsubps_avx(*(undefined1 (*) [32])((long)afStack_860 + lVar54),auVar55);
                auVar42 = vsubps_avx(auVar76,auVar3);
                auVar43 = vsubps_avx(*(undefined1 (*) [32])(auStack_780 + lVar54),auVar2);
                fVar10 = auVar55._0_4_;
                fVar91 = auVar59._0_4_;
                fVar12 = auVar55._4_4_;
                fVar92 = auVar59._4_4_;
                fVar14 = auVar55._8_4_;
                fVar93 = auVar59._8_4_;
                fVar16 = auVar55._12_4_;
                fVar94 = auVar59._12_4_;
                fVar18 = auVar55._16_4_;
                fVar95 = auVar59._16_4_;
                fVar20 = auVar55._20_4_;
                fVar96 = auVar59._20_4_;
                fVar22 = auVar55._24_4_;
                fVar97 = auVar59._24_4_;
                fVar24 = auVar55._28_4_;
                fVar90 = auVar59._28_4_ + fVar24;
                auVar56._0_4_ = fVar91 + fVar10 + auVar77._0_4_ * -4.25;
                auVar56._4_4_ = fVar92 + fVar12 + auVar77._4_4_ * -4.25;
                auVar56._8_4_ = fVar93 + fVar14 + auVar77._8_4_ * -4.25;
                auVar56._12_4_ = fVar94 + fVar16 + auVar77._12_4_ * -4.25;
                auVar56._16_4_ = fVar95 + fVar18 + auVar77._16_4_ * -4.25;
                auVar56._20_4_ = fVar96 + fVar20 + auVar77._20_4_ * -4.25;
                auVar56._24_4_ = fVar97 + fVar22 + auVar77._24_4_ * -4.25;
                auVar56._28_4_ = fVar90 + auVar42._28_4_;
                fVar11 = auVar2._0_4_;
                fVar78 = auVar3._0_4_;
                fVar13 = auVar2._4_4_;
                fVar81 = auVar3._4_4_;
                fVar15 = auVar2._8_4_;
                fVar84 = auVar3._8_4_;
                fVar17 = auVar2._12_4_;
                fVar85 = auVar3._12_4_;
                fVar19 = auVar2._16_4_;
                fVar86 = auVar3._16_4_;
                fVar21 = auVar2._20_4_;
                fVar87 = auVar3._20_4_;
                fVar23 = auVar2._24_4_;
                fVar88 = auVar3._24_4_;
                fVar25 = auVar2._28_4_;
                fVar89 = auVar3._28_4_;
                auVar82._0_4_ = auVar76._0_4_ * -4.25 + fVar78 + fVar11;
                auVar82._4_4_ = auVar76._4_4_ * -4.25 + fVar81 + fVar13;
                auVar82._8_4_ = auVar76._8_4_ * -4.25 + fVar84 + fVar15;
                auVar82._12_4_ = auVar76._12_4_ * -4.25 + fVar85 + fVar17;
                auVar82._16_4_ = auVar76._16_4_ * -4.25 + fVar86 + fVar19;
                auVar82._20_4_ = auVar76._20_4_ * -4.25 + fVar87 + fVar21;
                auVar82._24_4_ = auVar76._24_4_ * -4.25 + fVar88 + fVar23;
                auVar82._28_4_ = fVar90 + fVar89 + fVar25;
                auVar2 = vsubps_avx(auVar56,auVar82);
                fVar66 = auVar77._0_4_ * -1.25;
                fVar70 = auVar77._4_4_ * -1.25;
                fVar71 = auVar77._8_4_ * -1.25;
                fVar72 = auVar77._12_4_ * -1.25;
                fVar73 = auVar77._16_4_ * -1.25;
                fVar74 = auVar77._20_4_ * -1.25;
                fVar75 = auVar77._24_4_ * -1.25;
                auVar83._0_4_ = fVar91 * 0.25 + fVar66 + fVar10;
                auVar83._4_4_ = fVar92 * 0.25 + fVar70 + fVar12;
                auVar83._8_4_ = fVar93 * 0.25 + fVar71 + fVar14;
                auVar83._12_4_ = fVar94 * 0.25 + fVar72 + fVar16;
                auVar83._16_4_ = fVar95 * 0.25 + fVar73 + fVar18;
                auVar83._20_4_ = fVar96 * 0.25 + fVar74 + fVar20;
                auVar83._24_4_ = fVar97 * 0.25 + fVar75 + fVar22;
                auVar83._28_4_ = auVar77._28_4_ + 0.25 + fVar24;
                fVar90 = auVar76._0_4_ * -2.5;
                fVar60 = auVar76._4_4_ * -2.5;
                fVar61 = auVar76._8_4_ * -2.5;
                fVar62 = auVar76._12_4_ * -2.5;
                fVar63 = auVar76._16_4_ * -2.5;
                fVar64 = auVar76._20_4_ * -2.5;
                fVar65 = auVar76._24_4_ * -2.5;
                auVar99._0_4_ = fVar11 * fVar26 + fVar90 + fVar78 + fVar78;
                auVar99._4_4_ = fVar13 * fVar28 + fVar60 + fVar81 + fVar81;
                auVar99._8_4_ = fVar15 * fVar30 + fVar61 + fVar84 + fVar84;
                auVar99._12_4_ = fVar17 * fVar32 + fVar62 + fVar85 + fVar85;
                auVar99._16_4_ = fVar19 * fVar34 + fVar63 + fVar86 + fVar86;
                auVar99._20_4_ = fVar21 * fVar36 + fVar64 + fVar87 + fVar87;
                auVar99._24_4_ = fVar23 * fVar38 + fVar65 + fVar88 + fVar88;
                auVar99._28_4_ = auVar76._28_4_ + -1.25 + fVar89 + fVar89;
                auVar3 = vsubps_avx(auVar83,auVar99);
                auVar69._0_4_ = (fVar91 + fVar66) * fVar27 + fVar10;
                auVar69._4_4_ = (fVar92 + fVar70) * fVar29 + fVar12;
                auVar69._8_4_ = (fVar93 + fVar71) * fVar31 + fVar14;
                auVar69._12_4_ = (fVar94 + fVar72) * fVar33 + fVar16;
                auVar69._16_4_ = (fVar95 + fVar73) * fVar35 + fVar18;
                auVar69._20_4_ = (fVar96 + fVar74) * fVar37 + fVar20;
                auVar69._24_4_ = (fVar97 + fVar75) * fVar39 + fVar22;
                auVar69._28_4_ = auVar59._28_4_ + auVar77._28_4_ + fVar24;
                auVar59._0_4_ = fVar90 + fVar11 + fVar11 + fVar78 * fVar26;
                auVar59._4_4_ = fVar60 + fVar13 + fVar13 + fVar81 * fVar28;
                auVar59._8_4_ = fVar61 + fVar15 + fVar15 + fVar84 * fVar30;
                auVar59._12_4_ = fVar62 + fVar17 + fVar17 + fVar85 * fVar32;
                auVar59._16_4_ = fVar63 + fVar19 + fVar19 + fVar86 * fVar34;
                auVar59._20_4_ = fVar64 + fVar21 + fVar21 + fVar87 * fVar36;
                auVar59._24_4_ = fVar65 + fVar23 + fVar23 + fVar88 * fVar38;
                auVar59._28_4_ = auVar76._28_4_ + fVar25 + fVar25 + fVar25 + fVar25;
                auVar76._0_4_ = auVar69._0_4_ + auVar59._0_4_;
                auVar76._4_4_ = auVar69._4_4_ + auVar59._4_4_;
                auVar76._8_4_ = auVar69._8_4_ + auVar59._8_4_;
                auVar76._12_4_ = auVar69._12_4_ + auVar59._12_4_;
                auVar76._16_4_ = auVar69._16_4_ + auVar59._16_4_;
                auVar76._20_4_ = auVar69._20_4_ + auVar59._20_4_;
                auVar76._24_4_ = auVar69._24_4_ + auVar59._24_4_;
                auVar76._28_4_ = auVar69._28_4_ + auVar59._28_4_;
                auVar59 = vsubps_avx(auVar69,auVar59);
                pfVar1 = (float *)((long)pvVar9 + lVar47 + lVar51);
                *pfVar1 = auVar40._0_4_ * 5.25 + auVar41._0_4_;
                pfVar1[1] = auVar40._4_4_ * 5.25 + auVar41._4_4_;
                pfVar1[2] = auVar40._8_4_ * 5.25 + auVar41._8_4_;
                pfVar1[3] = auVar40._12_4_ * 5.25 + auVar41._12_4_;
                pfVar1[4] = auVar40._16_4_ * 5.25 + auVar41._16_4_;
                pfVar1[5] = auVar40._20_4_ * 5.25 + auVar41._20_4_;
                pfVar1[6] = auVar40._24_4_ * 5.25 + auVar41._24_4_;
                pfVar1[7] = auVar40._28_4_ + auVar41._28_4_;
                pfVar1 = (float *)((long)pvVar9 + lVar47 + (long)(iVar46 * 8) * 4 + lVar51);
                *pfVar1 = auVar82._0_4_ + auVar56._0_4_;
                pfVar1[1] = auVar82._4_4_ + auVar56._4_4_;
                pfVar1[2] = auVar82._8_4_ + auVar56._8_4_;
                pfVar1[3] = auVar82._12_4_ + auVar56._12_4_;
                pfVar1[4] = auVar82._16_4_ + auVar56._16_4_;
                pfVar1[5] = auVar82._20_4_ + auVar56._20_4_;
                pfVar1[6] = auVar82._24_4_ + auVar56._24_4_;
                pfVar1[7] = auVar82._28_4_ + auVar56._28_4_;
                *(undefined1 (*) [32])((long)pvVar9 + lVar47 + (long)(iVar46 * 0x10) * 4 + lVar51) =
                     auVar2;
                pfVar1 = (float *)((long)pvVar9 + lVar47 + (long)(iVar46 * 0x18) * 4 + lVar51);
                *pfVar1 = auVar83._0_4_ + auVar99._0_4_;
                pfVar1[1] = auVar83._4_4_ + auVar99._4_4_;
                pfVar1[2] = auVar83._8_4_ + auVar99._8_4_;
                pfVar1[3] = auVar83._12_4_ + auVar99._12_4_;
                pfVar1[4] = auVar83._16_4_ + auVar99._16_4_;
                pfVar1[5] = auVar83._20_4_ + auVar99._20_4_;
                pfVar1[6] = auVar83._24_4_ + auVar99._24_4_;
                pfVar1[7] = auVar83._28_4_ + auVar99._28_4_;
                *(undefined1 (*) [32])((long)pvVar9 + lVar47 + (long)(iVar46 * 0x20) * 4 + lVar51) =
                     auVar3;
                *(undefined1 (*) [32])((long)pvVar9 + lVar47 + (long)(iVar46 * 0x28) * 4 + lVar51) =
                     auVar76;
                *(undefined1 (*) [32])((long)pvVar9 + lVar47 + (long)(iVar46 * 0x30) * 4 + lVar51) =
                     auVar59;
                pfVar1 = (float *)((long)pvVar9 + lVar47 + (long)(iVar46 * 0x38) * 4 + lVar51);
                *pfVar1 = auVar43._0_4_ + auVar42._0_4_ * 5.25;
                pfVar1[1] = auVar43._4_4_ + auVar42._4_4_ * 5.25;
                pfVar1[2] = auVar43._8_4_ + auVar42._8_4_ * 5.25;
                pfVar1[3] = auVar43._12_4_ + auVar42._12_4_ * 5.25;
                pfVar1[4] = auVar43._16_4_ + auVar42._16_4_ * 5.25;
                pfVar1[5] = auVar43._20_4_ + auVar42._20_4_ * 5.25;
                pfVar1[6] = auVar43._24_4_ + auVar42._24_4_ * 5.25;
                pfVar1[7] = auVar43._28_4_ + auVar42._28_4_;
                lVar54 = lVar54 + 0x100;
                lVar47 = lVar47 + (long)(iVar46 * 0x40) * 4;
              } while (lVar54 != 0x800);
              auVar100 = ZEXT3264(auVar98);
              auVar80 = ZEXT3264(auVar79);
              uVar52 = uVar52 + 1;
              lVar50 = lVar50 + 0x20;
            } while (uVar52 != uVar49);
          }
          uVar48 = uVar48 + 1;
          local_8f0 = local_8f0 + (long)iVar7 * sVar8 * 6;
          local_8f8 = local_8f8 + (long)(int)uVar45 * 0x20;
        } while (uVar48 != uVar44);
      }
      local_900 = local_900 + 1;
    } while (local_900 != iVar4);
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_input_pack8_avx(const Mat& bottom_blob, Mat& bottom_blob_tm, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int inch = bottom_blob.c;

    const int w_tiles = (w - 2) / 6;
    const int h_tiles = (h - 2) / 6;
    const int tiles = w_tiles * h_tiles;

    // const float itm[8][8] = {
    //     {1.0f,  0.0f, -5.25f,  0.00f,  5.25f,  0.00f, -1.0f, 0.0f},
    //
    //     {0.0f,  1.0f,  1.00f, -4.25f, -4.25f,  1.00f,  1.0f, 0.0f},
    //     {0.0f, -1.0f,  1.00f,  4.25f, -4.25f, -1.00f,  1.0f, 0.0f},
    //
    //     {0.0f,  0.5f,  0.25f, -2.50f, -1.25f,  2.00f,  1.0f, 0.0f},
    //     {0.0f, -0.5f,  0.25f,  2.50f, -1.25f, -2.00f,  1.0f, 0.0f},
    //
    //     {0.0f,  2.0f,  4.00f, -2.50f, -5.00f,  0.50f,  1.0f, 0.0f},
    //     {0.0f, -2.0f,  4.00f,  2.50f, -5.00f, -0.50f,  1.0f, 0.0f},
    //
    //     {0.0f, -1.0f,  0.00f,  5.25f,  0.00f, -5.25f,  0.0f, 1.0f}
    // };

    // 0 = r00 - r06 + (r04 - r02) * 5.25
    // 7 = r07 - r01 + (r03 - r05) * 5.25

    // 1 = (r02 + r06 - r04 * 4.25) + (r01 - r03 * 4.25 + r05)
    // 2 = (r02 + r06 - r04 * 4.25) - (r01 - r03 * 4.25 + r05)

    // 3 = (r06 + r02 * 0.25 - r04 * 1.25) + (r01 * 0.5 - r03 * 2.5 + r05 * 2)
    // 4 = (r06 + r02 * 0.25 - r04 * 1.25) - (r01 * 0.5 - r03 * 2.5 + r05 * 2)

    // reuse r04 * 1.25
    // reuse r03 * 2.5
    // 5 = (r06 + (r02 - r04 * 1.25) * 4) + (r01 * 2 - r03 * 2.5 + r05 * 0.5)
    // 6 = (r06 + (r02 - r04 * 1.25) * 4) - (r01 * 2 - r03 * 2.5 + r05 * 0.5)

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        Mat img0_tm = bottom_blob_tm.channel(q);

#ifdef _MSC_VER
        __declspec(align(32))
#else
        __attribute__((aligned(32)))
#endif
        float tmp[8][8][8];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* r0 = img0.row(i * 6) + (j * 6) * 8;

                for (int m = 0; m < 8; m++)
                {
                    __m256 _r00 = _mm256_load_ps(r0);
                    __m256 _r01 = _mm256_load_ps(r0 + 8);
                    __m256 _r02 = _mm256_load_ps(r0 + 16);
                    __m256 _r03 = _mm256_load_ps(r0 + 24);
                    __m256 _r04 = _mm256_load_ps(r0 + 32);
                    __m256 _r05 = _mm256_load_ps(r0 + 40);
                    __m256 _r06 = _mm256_load_ps(r0 + 48);
                    __m256 _r07 = _mm256_load_ps(r0 + 56);

                    __m256 _tmp0m = _mm256_comp_fmadd_ps(_mm256_set1_ps(5.25f), _mm256_sub_ps(_r04, _r02), _mm256_sub_ps(_r00, _r06));
                    __m256 _tmp7m = _mm256_comp_fmadd_ps(_mm256_set1_ps(5.25f), _mm256_sub_ps(_r03, _r05), _mm256_sub_ps(_r07, _r01));

                    __m256 _tmp12a = _mm256_comp_fmadd_ps(_mm256_set1_ps(-4.25f), _r04, _mm256_add_ps(_r02, _r06));
                    __m256 _tmp12b = _mm256_comp_fmadd_ps(_mm256_set1_ps(-4.25f), _r03, _mm256_add_ps(_r01, _r05));

                    __m256 _tmp1m = _mm256_add_ps(_tmp12a, _tmp12b);
                    __m256 _tmp2m = _mm256_sub_ps(_tmp12a, _tmp12b);

                    __m256 _tmp34a = _mm256_comp_fmadd_ps(_mm256_set1_ps(-1.25f), _r04, _mm256_comp_fmadd_ps(_mm256_set1_ps(0.25f), _r02, _r06));
                    __m256 _tmp34b = _mm256_comp_fmadd_ps(_mm256_set1_ps(2.f), _r05, _mm256_comp_fmadd_ps(_mm256_set1_ps(-2.5f), _r03, _mm256_mul_ps(_r01, _mm256_set1_ps(0.5f))));

                    __m256 _tmp3m = _mm256_add_ps(_tmp34a, _tmp34b);
                    __m256 _tmp4m = _mm256_sub_ps(_tmp34a, _tmp34b);

                    __m256 _tmp56a = _mm256_comp_fmadd_ps(_mm256_set1_ps(4.f), _mm256_comp_fmadd_ps(_mm256_set1_ps(-1.25f), _r04, _r02), _r06);
                    __m256 _tmp56b = _mm256_comp_fmadd_ps(_mm256_set1_ps(0.5f), _r05, _mm256_comp_fmadd_ps(_mm256_set1_ps(-2.5f), _r03, _mm256_mul_ps(_r01, _mm256_set1_ps(2.f))));

                    __m256 _tmp5m = _mm256_add_ps(_tmp56a, _tmp56b);
                    __m256 _tmp6m = _mm256_sub_ps(_tmp56a, _tmp56b);

#if defined(__GNUC__) && (__GNUC__ <= 4) && (__GNUC_MINOR__ < 6)
                    // old gcc breaks stack variable alignement
                    // ref https://gcc.gnu.org/bugzilla/show_bug.cgi?id=16660
                    _mm256_storeu_ps(tmp[0][m], _tmp0m);
                    _mm256_storeu_ps(tmp[1][m], _tmp1m);
                    _mm256_storeu_ps(tmp[2][m], _tmp2m);
                    _mm256_storeu_ps(tmp[3][m], _tmp3m);
                    _mm256_storeu_ps(tmp[4][m], _tmp4m);
                    _mm256_storeu_ps(tmp[5][m], _tmp5m);
                    _mm256_storeu_ps(tmp[6][m], _tmp6m);
                    _mm256_storeu_ps(tmp[7][m], _tmp7m);
#else
                    _mm256_store_ps(tmp[0][m], _tmp0m);
                    _mm256_store_ps(tmp[1][m], _tmp1m);
                    _mm256_store_ps(tmp[2][m], _tmp2m);
                    _mm256_store_ps(tmp[3][m], _tmp3m);
                    _mm256_store_ps(tmp[4][m], _tmp4m);
                    _mm256_store_ps(tmp[5][m], _tmp5m);
                    _mm256_store_ps(tmp[6][m], _tmp6m);
                    _mm256_store_ps(tmp[7][m], _tmp7m);
#endif

                    r0 += w * 8;
                }

                float* r0_tm_0 = (float*)img0_tm + (i * w_tiles + j) * 8;
                float* r0_tm_1 = r0_tm_0 + tiles * 8;
                float* r0_tm_2 = r0_tm_0 + tiles * 16;
                float* r0_tm_3 = r0_tm_0 + tiles * 24;
                float* r0_tm_4 = r0_tm_0 + tiles * 32;
                float* r0_tm_5 = r0_tm_0 + tiles * 40;
                float* r0_tm_6 = r0_tm_0 + tiles * 48;
                float* r0_tm_7 = r0_tm_0 + tiles * 56;

                for (int m = 0; m < 8; m++)
                {
#if defined(__GNUC__) && (__GNUC__ <= 4) && (__GNUC_MINOR__ < 6)
                    __m256 _tmp00 = _mm256_loadu_ps(tmp[m][0]);
                    __m256 _tmp01 = _mm256_loadu_ps(tmp[m][1]);
                    __m256 _tmp02 = _mm256_loadu_ps(tmp[m][2]);
                    __m256 _tmp03 = _mm256_loadu_ps(tmp[m][3]);
                    __m256 _tmp04 = _mm256_loadu_ps(tmp[m][4]);
                    __m256 _tmp05 = _mm256_loadu_ps(tmp[m][5]);
                    __m256 _tmp06 = _mm256_loadu_ps(tmp[m][6]);
                    __m256 _tmp07 = _mm256_loadu_ps(tmp[m][7]);
#else
                    __m256 _tmp00 = _mm256_load_ps(tmp[m][0]);
                    __m256 _tmp01 = _mm256_load_ps(tmp[m][1]);
                    __m256 _tmp02 = _mm256_load_ps(tmp[m][2]);
                    __m256 _tmp03 = _mm256_load_ps(tmp[m][3]);
                    __m256 _tmp04 = _mm256_load_ps(tmp[m][4]);
                    __m256 _tmp05 = _mm256_load_ps(tmp[m][5]);
                    __m256 _tmp06 = _mm256_load_ps(tmp[m][6]);
                    __m256 _tmp07 = _mm256_load_ps(tmp[m][7]);
#endif

                    __m256 _r0tm0 = _mm256_comp_fmadd_ps(_mm256_set1_ps(5.25f), _mm256_sub_ps(_tmp04, _tmp02), _mm256_sub_ps(_tmp00, _tmp06));
                    __m256 _r0tm7 = _mm256_comp_fmadd_ps(_mm256_set1_ps(5.25f), _mm256_sub_ps(_tmp03, _tmp05), _mm256_sub_ps(_tmp07, _tmp01));

                    __m256 _tmp12a = _mm256_comp_fmadd_ps(_mm256_set1_ps(-4.25f), _tmp04, _mm256_add_ps(_tmp02, _tmp06));
                    __m256 _tmp12b = _mm256_comp_fmadd_ps(_mm256_set1_ps(-4.25f), _tmp03, _mm256_add_ps(_tmp01, _tmp05));

                    __m256 _r0tm1 = _mm256_add_ps(_tmp12a, _tmp12b);
                    __m256 _r0tm2 = _mm256_sub_ps(_tmp12a, _tmp12b);

                    __m256 _tmp34a = _mm256_comp_fmadd_ps(_mm256_set1_ps(-1.25f), _tmp04, _mm256_comp_fmadd_ps(_mm256_set1_ps(0.25f), _tmp02, _tmp06));
                    __m256 _tmp34b = _mm256_comp_fmadd_ps(_mm256_set1_ps(2.f), _tmp05, _mm256_comp_fmadd_ps(_mm256_set1_ps(-2.5f), _tmp03, _mm256_mul_ps(_tmp01, _mm256_set1_ps(0.5f))));

                    __m256 _r0tm3 = _mm256_add_ps(_tmp34a, _tmp34b);
                    __m256 _r0tm4 = _mm256_sub_ps(_tmp34a, _tmp34b);

                    __m256 _tmp56a = _mm256_comp_fmadd_ps(_mm256_set1_ps(4.f), _mm256_comp_fmadd_ps(_mm256_set1_ps(-1.25f), _tmp04, _tmp02), _tmp06);
                    __m256 _tmp56b = _mm256_comp_fmadd_ps(_mm256_set1_ps(0.5f), _tmp05, _mm256_comp_fmadd_ps(_mm256_set1_ps(-2.5f), _tmp03, _mm256_mul_ps(_tmp01, _mm256_set1_ps(2.f))));

                    __m256 _r0tm5 = _mm256_add_ps(_tmp56a, _tmp56b);
                    __m256 _r0tm6 = _mm256_sub_ps(_tmp56a, _tmp56b);

                    _mm256_store_ps(r0_tm_0, _r0tm0);
                    _mm256_store_ps(r0_tm_1, _r0tm1);
                    _mm256_store_ps(r0_tm_2, _r0tm2);
                    _mm256_store_ps(r0_tm_3, _r0tm3);
                    _mm256_store_ps(r0_tm_4, _r0tm4);
                    _mm256_store_ps(r0_tm_5, _r0tm5);
                    _mm256_store_ps(r0_tm_6, _r0tm6);
                    _mm256_store_ps(r0_tm_7, _r0tm7);

                    r0_tm_0 += tiles * 64;
                    r0_tm_1 += tiles * 64;
                    r0_tm_2 += tiles * 64;
                    r0_tm_3 += tiles * 64;
                    r0_tm_4 += tiles * 64;
                    r0_tm_5 += tiles * 64;
                    r0_tm_6 += tiles * 64;
                    r0_tm_7 += tiles * 64;
                }
            }
        }
    }
}